

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

int ov_fopen(char *path,OggVorbis_File *vf)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar1 = ov_open((FILE *)__stream,vf,(char *)0x0,0);
    iVar2 = 0;
    if (iVar1 != 0) {
      fclose(__stream);
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int ov_fopen(const char *path,OggVorbis_File *vf){
  int ret;
  FILE *f = fopen(path,"rb");
  if(!f) return -1;

  ret = ov_open(f,vf,NULL,0);
  if(ret) fclose(f);
  return ret;
}